

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O1

bool google::protobuf::compiler::ruby::GenerateDslDescriptor
               (FileDescriptor *file,Printer *printer,string *error)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  Syntax syntax;
  long lVar1;
  long lVar2;
  string local_48;
  
  io::Printer::Print<>(printer,"Google::Protobuf::DescriptorPool.generated_pool.build do\n");
  io::Printer::Indent(printer);
  args_1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)file;
  StringifySyntax_abi_cxx11_(&local_48,(ruby *)(ulong)(byte)file[0x3a],syntax);
  io::Printer::Print<char[9],std::__cxx11::string,char[7],std::__cxx11::string>
            (printer,"add_file(\"$filename$\", :syntax => :$syntax$) do\n",(char (*) [9])"filename",
             args_1,(char (*) [7])0x3f7b95,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  io::Printer::Indent(printer);
  if (0 < *(int *)(file + 0x2c)) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      GenerateMessage((Descriptor *)(*(long *)(file + 0x58) + lVar1),printer,error);
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x88;
    } while (lVar2 < *(int *)(file + 0x2c));
  }
  if (0 < *(int *)(file + 0x30)) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      GenerateEnum((EnumDescriptor *)(*(long *)(file + 0x60) + lVar2),printer);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x48;
    } while (lVar1 < *(int *)(file + 0x30));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"end\n");
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"end\n\n");
  return true;
}

Assistant:

bool GenerateDslDescriptor(const FileDescriptor* file, io::Printer* printer,
                           std::string* error) {
  printer->Print("Google::Protobuf::DescriptorPool.generated_pool.build do\n");
  printer->Indent();
  printer->Print("add_file(\"$filename$\", :syntax => :$syntax$) do\n",
                 "filename", file->name(), "syntax",
                 StringifySyntax(file->syntax()));
  printer->Indent();
  for (int i = 0; i < file->message_type_count(); i++) {
    if (!GenerateMessage(file->message_type(i), printer, error)) {
      return false;
    }
  }
  for (int i = 0; i < file->enum_type_count(); i++) {
    GenerateEnum(file->enum_type(i), printer);
  }
  printer->Outdent();
  printer->Print("end\n");
  printer->Outdent();
  printer->Print(
    "end\n\n");
  return true;
}